

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * qGssapiContinue(QAuthenticatorPrivate *ctx,QByteArrayView challenge)

{
  gss_name_t pgVar1;
  bool bVar2;
  int iVar3;
  QGssApiHandles *pQVar4;
  QGssApiHandles *pQVar5;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  OM_uint32 majStat;
  QByteArray *result;
  gss_buffer_desc outBuf;
  gss_buffer_desc inBuf;
  OM_uint32 ignored;
  OM_uint32 minStat;
  OM_uint32 minStat_00;
  OM_uint32 in_stack_ffffffffffffff2c;
  QByteArray *this;
  QGssApiHandles *local_98;
  QByteArray local_58;
  long local_40;
  char *local_38;
  QGssApiHandles local_30;
  undefined4 local_20;
  undefined4 local_1c;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0xaaaaaaaa;
  local_20 = 0xaaaaaaaa;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x2087f7);
  memset(&local_30,0,0x10);
  local_40 = -0x5555555555555556;
  local_38 = (char *)0xaaaaaaaaaaaaaaaa;
  bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x208836);
  if (!bVar2) {
    local_30.targetName = (gss_name_t)QByteArrayView::data(&local_18);
    local_30.gssCtx = (gss_ctx_id_t)QByteArrayView::size(&local_18);
  }
  pQVar4 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                     ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                      (in_RSI + 0x88));
  pQVar5 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                     ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                      (in_RSI + 0x88));
  pgVar1 = pQVar5->targetName;
  bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x2088a1);
  if (bVar2) {
    local_98 = (QGssApiHandles *)0x0;
  }
  else {
    local_98 = &local_30;
  }
  minStat_00 = 0;
  this = (QByteArray *)0x0;
  iVar3 = gss_init_sec_context(&local_1c,0,pQVar4,pgVar1,0,2);
  if (local_40 != 0) {
    QByteArray::QByteArray(&local_58,local_38,local_40);
    QByteArray::operator=(this,(QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,minStat_00));
    QByteArray::~QByteArray((QByteArray *)0x208973);
  }
  gss_release_buffer(&local_20,&local_40);
  if ((iVar3 != 0) && (iVar3 != 1)) {
    q_GSSAPI_error((char *)this,in_stack_ffffffffffffff2c,minStat_00);
    pQVar4 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                       ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                        (in_RSI + 0x88));
    gss_release_name(&local_20,&pQVar4->targetName);
    pQVar4 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                       ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                        (in_RSI + 0x88));
    if (pQVar4->gssCtx != (gss_ctx_id_t)0x0) {
      pQVar4 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                         ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                          (in_RSI + 0x88));
      gss_delete_sec_context(&local_20,pQVar4,0);
    }
    QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::reset
              ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)this,
               local_98);
  }
  if (iVar3 == 0) {
    pQVar4 = QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::operator->
                       ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                        (in_RSI + 0x88));
    gss_release_name(&local_20,&pQVar4->targetName);
    QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::reset
              ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)this,
               local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QByteArray qGssapiContinue(QAuthenticatorPrivate *ctx, QByteArrayView challenge)
{
    OM_uint32 majStat, minStat, ignored;
    QByteArray result;
    gss_buffer_desc inBuf = {0, nullptr}; // GSS input token
    gss_buffer_desc outBuf; // GSS output token

    if (!challenge.isEmpty()) {
        inBuf.value = const_cast<char*>(challenge.data());
        inBuf.length = challenge.size();
    }

    majStat = gss_init_sec_context(&minStat,
                                   GSS_C_NO_CREDENTIAL,
                                   &ctx->gssApiHandles->gssCtx,
                                   ctx->gssApiHandles->targetName,
                                   GSS_C_NO_OID,
                                   GSS_C_MUTUAL_FLAG,
                                   0,
                                   GSS_C_NO_CHANNEL_BINDINGS,
                                   challenge.isEmpty() ? GSS_C_NO_BUFFER : &inBuf,
                                   nullptr,
                                   &outBuf,
                                   nullptr,
                                   nullptr);

    if (outBuf.length != 0)
        result = QByteArray(reinterpret_cast<const char*>(outBuf.value), outBuf.length);
    gss_release_buffer(&ignored, &outBuf);

    if (majStat != GSS_S_COMPLETE && majStat != GSS_S_CONTINUE_NEEDED) {
        q_GSSAPI_error("gss_init_sec_context error", majStat, minStat);
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        if (ctx->gssApiHandles->gssCtx)
            gss_delete_sec_context(&ignored, &ctx->gssApiHandles->gssCtx, GSS_C_NO_BUFFER);
        ctx->gssApiHandles.reset(nullptr);
    }

    if (majStat == GSS_S_COMPLETE) {
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        ctx->gssApiHandles.reset(nullptr);
    }

    return result;
}